

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

TiXmlHandle __thiscall TiXmlHandle::Child(TiXmlHandle *this,char *value,int count)

{
  TiXmlNode *this_00;
  int in_ECX;
  undefined4 in_register_00000014;
  int iVar1;
  
  if (*(TiXmlNode **)value != (TiXmlNode *)0x0) {
    this_00 = TiXmlNode::FirstChild
                        (*(TiXmlNode **)value,(char *)CONCAT44(in_register_00000014,count));
    for (iVar1 = 0; (this_00 != (TiXmlNode *)0x0 && (iVar1 < in_ECX)); iVar1 = iVar1 + 1) {
      this_00 = TiXmlNode::NextSibling(this_00,(char *)CONCAT44(in_register_00000014,count));
    }
    if (this_00 != (TiXmlNode *)0x0) goto LAB_0016a963;
  }
  this_00 = (TiXmlNode *)0x0;
LAB_0016a963:
  this->node = this_00;
  return (TiXmlHandle)(TiXmlNode *)this;
}

Assistant:

TiXmlHandle TiXmlHandle::Child( const char* value, int count ) const
{
	if ( node )
	{
		int i;
		TiXmlNode* child = node->FirstChild( value );
		for (	i=0;
				child && i<count;
				child = child->NextSibling( value ), ++i )
		{
			// nothing
		}
		if ( child )
			return TiXmlHandle( child );
	}
	return TiXmlHandle( 0 );
}